

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  byte *pbVar1;
  nk_style_item_data *img;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_window *pnVar7;
  nk_vec2 nVar8;
  nk_user_font *f;
  char *string;
  uint uVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  nk_style_window *pnVar13;
  ulong uVar14;
  ulong uVar15;
  nk_context *in;
  nk_command_buffer *b;
  nk_panel *pnVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  nk_rect r;
  nk_rect rect;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b_00;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect r_01;
  nk_flags ws;
  nk_text text;
  nk_flags local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  nk_text local_88;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_command_buffer *local_50;
  undefined1 local_48 [16];
  
  local_98 = title;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3ca5,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3ca6,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  pnVar16 = ctx->current->layout;
  if (pnVar16 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x3ca7,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  uVar14 = (ulong)pnVar16 & 3;
  if (uVar14 == 0) {
    uVar15 = 0x1c0;
  }
  else {
    memset(pnVar16,0,4 - uVar14);
    uVar15 = uVar14 | 0x1bc;
    pnVar16 = (nk_panel *)((long)pnVar16 + (4 - uVar14));
  }
  uVar14 = (ulong)((uint)uVar15 & 0xfffffffc);
  memset(pnVar16,0,uVar14);
  if ((uVar15 & 3) != 0) {
    memset((void *)((long)&pnVar16->type + uVar14),0,uVar15 & 3);
  }
  pnVar7 = ctx->current;
  uVar9 = pnVar7->flags;
  if ((uVar9 & 0x6000) == 0) {
    local_a8 = (ctx->style).font;
    pnVar16 = pnVar7->layout;
    in = (nk_context *)0x0;
    if ((uVar9 >> 10 & 1) == 0) {
      in = ctx;
    }
    local_b8._0_4_ = (ctx->style).window.scrollbar_size.x;
    local_d8 = CONCAT44(local_d8._4_4_,(ctx->style).window.scrollbar_size.y);
    nVar8 = nk_panel_get_padding(&ctx->style,panel_type);
    fVar21 = nVar8.x;
    fVar18 = nVar8.y;
    if ((uVar9 & 0x1002) == 2) {
      if ((local_98 != (char *)0x0) && ((uVar9 & 0x58) != 0)) {
        fVar18 = (ctx->style).window.header.padding.y;
        fVar19 = (ctx->style).window.header.label_padding.y;
        fVar18 = fVar19 + fVar19 + fVar18 + fVar18 + local_a8->height;
      }
      fVar19 = (pnVar7->bounds).x;
      fVar20 = (pnVar7->bounds).y;
      iVar10 = (in->input).mouse.buttons[0].down;
      bVar12 = true;
      if (((in != (nk_context *)0x0) &&
          (fVar17 = (in->input).mouse.buttons[0].clicked_pos.x, fVar19 <= fVar17)) &&
         (fVar17 < fVar19 + (pnVar7->bounds).w)) {
        fVar17 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar12 = iVar10 != 1 || (fVar18 + fVar20 <= fVar17 || fVar17 < fVar20);
      }
      if (((iVar10 != 0) && (!bVar12)) && ((in->input).mouse.buttons[0].clicked == 0)) {
        fVar18 = (in->input).mouse.delta.x;
        (pnVar7->bounds).x = fVar19 + fVar18;
        fVar19 = (in->input).mouse.delta.y;
        (pnVar7->bounds).y = fVar20 + fVar19;
        (in->input).mouse.buttons[0].clicked_pos.x =
             fVar18 + (in->input).mouse.buttons[0].clicked_pos.x;
        (in->input).mouse.buttons[0].clicked_pos.y =
             fVar19 + (in->input).mouse.buttons[0].clicked_pos.y;
        (ctx->style).cursor_active = (ctx->style).cursors[2];
      }
    }
    pnVar16->type = panel_type;
    pnVar16->flags = uVar9;
    fVar18 = (pnVar7->bounds).y;
    fVar19 = (pnVar7->bounds).w;
    fVar20 = (pnVar7->bounds).h;
    (pnVar16->bounds).x = (pnVar7->bounds).x;
    (pnVar16->bounds).y = fVar18;
    (pnVar16->bounds).w = fVar19;
    (pnVar16->bounds).h = fVar20;
    (pnVar16->bounds).x = (pnVar16->bounds).x + fVar21;
    (pnVar16->bounds).w = (pnVar16->bounds).w - (fVar21 + fVar21);
    local_c8._8_4_ = extraout_XMM0_Dc;
    local_c8._0_4_ = nVar8.x;
    local_c8._4_4_ = nVar8.y;
    local_c8._12_4_ = extraout_XMM0_Dd;
    if ((pnVar7->flags & 1) == 0) {
      pnVar16->border = 0.0;
    }
    else {
      lVar11 = 0x1e68;
      if ((int)panel_type < 0x10) {
        if (panel_type == NK_PANEL_GROUP) {
          lVar11 = 0x1e78;
        }
        else if (panel_type == NK_PANEL_POPUP) {
          lVar11 = 0x1e80;
        }
      }
      else if (panel_type == NK_PANEL_CONTEXTUAL) {
        lVar11 = 0x1e70;
      }
      else if (panel_type == NK_PANEL_COMBO) {
        lVar11 = 0x1e6c;
      }
      else if (panel_type == NK_PANEL_MENU) {
        lVar11 = 0x1e74;
      }
      fVar21 = *(float *)((long)&(ctx->input).keyboard.keys[0].down + lVar11);
      pnVar16->border = fVar21;
      uVar3 = (pnVar16->bounds).x;
      uVar5 = (pnVar16->bounds).y;
      uVar4 = (pnVar16->bounds).w;
      uVar6 = (pnVar16->bounds).h;
      fVar18 = fVar21 + fVar21;
      fVar19 = fVar18;
      if (fVar18 <= (float)uVar4) {
        fVar19 = (float)uVar4;
      }
      if (fVar18 <= (float)uVar6) {
        fVar18 = (float)uVar6;
      }
      (pnVar16->bounds).x = fVar21 + (float)uVar3;
      (pnVar16->bounds).y = (float)uVar5 + fVar21;
      (pnVar16->bounds).w = fVar19 + fVar21 * -2.0;
      (pnVar16->bounds).h = fVar21 * -2.0 + fVar18;
    }
    fVar21 = (pnVar16->bounds).y;
    pnVar16->at_x = (pnVar16->bounds).x;
    pnVar16->at_y = fVar21;
    pnVar16->max_x = 0.0;
    pnVar16->footer_height = 0.0;
    pnVar16->header_height = 0.0;
    nk_layout_reset_min_row_height(ctx);
    (pnVar16->row).index = 0;
    (pnVar16->row).columns = 0;
    (pnVar16->row).ratio = (float *)0x0;
    (pnVar16->row).item_width = 0.0;
    (pnVar16->row).tree_depth = 0;
    (pnVar16->row).height = (float)local_c8._4_4_;
    pnVar16->has_scrolling = 1;
    uVar9 = pnVar7->flags;
    if ((uVar9 & 0x20) == 0) {
      (pnVar16->bounds).w = (pnVar16->bounds).w - (float)local_b8._0_4_;
    }
    if ((panel_type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)) ==
        NK_PANEL_NONE) {
      fVar21 = 0.0;
      if ((uVar9 & 0x24) != 0x20) {
        fVar21 = (float)local_d8;
      }
      pnVar16->footer_height = fVar21;
      (pnVar16->bounds).h = (pnVar16->bounds).h - fVar21;
    }
    b = &pnVar7->buffer;
    if (((local_98 != (char *)0x0) && ((pnVar7->flags & 0x58) != 0)) &&
       ((pnVar7->flags & 0x2000) == 0)) {
      fVar21 = (pnVar7->bounds).x;
      fVar18 = (pnVar7->bounds).y;
      _local_b8 = ZEXT416((uint)fVar18);
      local_c8._0_4_ = (pnVar7->bounds).x;
      local_c8._4_4_ = (pnVar7->bounds).y;
      fVar19 = (pnVar7->bounds).w;
      fVar20 = (ctx->style).window.header.padding.y;
      fVar17 = (ctx->style).window.header.label_padding.y;
      fVar20 = fVar17 + fVar17 + fVar20 + fVar20 + local_a8->height;
      pnVar16->header_height = fVar20;
      (pnVar16->bounds).y = (pnVar16->bounds).y + fVar20;
      (pnVar16->bounds).h = (pnVar16->bounds).h - fVar20;
      pnVar16->at_y = pnVar16->at_y + fVar20;
      if (ctx->active == pnVar7) {
        pnVar13 = (nk_style_window *)&(ctx->style).window.header.active;
        local_88.text = (ctx->style).window.header.label_active;
      }
      else {
        fVar17 = (ctx->input).mouse.pos.x;
        if ((((fVar17 < fVar21) || (fVar21 + fVar19 <= fVar17)) ||
            (fVar17 = (ctx->input).mouse.pos.y, fVar17 < fVar18)) || (fVar18 + fVar20 <= fVar17)) {
          pnVar13 = &(ctx->style).window;
          local_88.text = (ctx->style).window.header.label_normal;
        }
        else {
          pnVar13 = (nk_style_window *)&(ctx->style).window.header.hover;
          local_88.text = (ctx->style).window.header.label_hover;
        }
      }
      _local_78 = ZEXT416((uint)fVar21);
      fVar20 = fVar20 + 1.0;
      local_68 = ZEXT416((uint)fVar20);
      local_48 = ZEXT416((uint)fVar19);
      local_c8._8_8_ = 0;
      local_d8 = CONCAT44(fVar20,fVar19);
      uStack_d0 = 0;
      if ((pnVar13->header).normal.type == NK_STYLE_ITEM_IMAGE) {
        local_88.background.r = '\0';
        local_88.background.g = '\0';
        local_88.background.b = '\0';
        local_88.background.a = '\0';
        r.h = fVar20;
        r.w = fVar19;
        r.x = (float)local_c8._0_4_;
        r.y = (float)local_c8._4_4_;
        nk_draw_image(b,r,&(pnVar13->header).normal.data.image,(nk_color)0xffffffff);
      }
      else {
        local_88.background = (pnVar13->header).normal.data.color;
        rect.h = fVar20;
        rect.w = fVar19;
        rect.x = (float)local_c8._0_4_;
        rect.y = (float)local_c8._4_4_;
        nk_fill_rect(b,rect,0.0,local_88.background);
      }
      fVar21 = (ctx->style).window.header.padding.y;
      fVar19 = (float)local_b8._0_4_ + fVar21;
      fVar21 = (float)local_68._0_4_ - (fVar21 + fVar21);
      fVar18 = fVar21;
      fVar20 = fVar21;
      if ((pnVar7->flags & 8) != 0) {
        local_dc = 0;
        local_68._0_4_ = fVar21;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          fVar18 = (ctx->style).window.header.padding.x;
          local_b8._0_4_ = ((float)local_78._0_4_ + (float)local_48._0_4_) - (fVar21 + fVar18);
          local_d8 = CONCAT44(local_d8._4_4_,
                              (float)local_48._0_4_ -
                              ((ctx->style).window.header.spacing.x + fVar21 + fVar18));
        }
        else {
          fVar18 = (ctx->style).window.header.padding.x;
          local_b8._0_4_ = (float)local_78._0_4_ + fVar18;
          local_c8._0_4_ =
               (ctx->style).window.header.spacing.x + fVar21 + fVar18 + (float)local_78._0_4_;
        }
        local_b8._4_4_ = fVar19;
        fStack_b0 = fVar19;
        fStack_ac = fVar19;
        local_78._4_4_ = fVar21;
        local_78._0_4_ = fVar21;
        fStack_70 = fVar21;
        fStack_6c = fVar21;
        bounds.y = fVar19;
        bounds.x = (float)local_b8._0_4_;
        bounds.h = fVar21;
        bounds.w = fVar21;
        iVar10 = nk_do_button_symbol(&local_dc,b,bounds,(ctx->style).window.header.close_symbol,
                                     NK_BUTTON_DEFAULT,&(ctx->style).window.header.close_button,
                                     &in->input,(ctx->style).font);
        if ((iVar10 != 0) && ((pnVar7->flags & 0x1000) == 0)) {
          pnVar16->flags = pnVar16->flags & 0xffff5fff | 0x2000;
        }
        fVar21 = (float)local_78._0_4_;
        fVar18 = (float)local_78._4_4_;
        fVar19 = (float)local_b8._4_4_;
        fVar20 = (float)local_68._0_4_;
      }
      local_50 = b;
      if ((pnVar7->flags & 0x10) != 0) {
        local_dc = 0;
        fVar17 = (float)local_c8._0_4_;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          fVar17 = ((float)local_d8 + (float)local_c8._0_4_) - fVar20;
          if ((pnVar7->flags & 8) == 0) {
            fVar2 = (ctx->style).window.header.padding.x;
            fVar17 = fVar17 - fVar2;
            local_d8._0_4_ = (float)local_d8 - fVar2;
          }
          local_d8 = CONCAT44(local_d8._4_4_,
                              (float)local_d8 - (fVar20 + (ctx->style).window.header.spacing.x));
        }
        else {
          local_c8._0_4_ =
               (float)local_c8._0_4_ +
               fVar20 + (ctx->style).window.header.spacing.x + (ctx->style).window.header.padding.x;
        }
        bounds_00.y = fVar19;
        bounds_00.x = fVar17;
        bounds_00.h = fVar18;
        bounds_00.w = fVar21;
        iVar10 = nk_do_button_symbol(&local_dc,b,bounds_00,
                                     (&(ctx->style).window.header.minimize_symbol)
                                     [(ushort)((ushort)pnVar16->flags >> 0xf)],NK_BUTTON_DEFAULT,
                                     &(ctx->style).window.header.minimize_button,&in->input,
                                     (ctx->style).font);
        if ((iVar10 != 0) && ((pnVar7->flags & 0x1000) == 0)) {
          pbVar1 = (byte *)((long)&pnVar16->flags + 1);
          *pbVar1 = *pbVar1 ^ 0x80;
        }
      }
      string = local_98;
      iVar10 = nk_strlen(local_98);
      f = local_a8;
      fVar19 = (*local_a8->width)(local_a8->userdata,local_a8->height,string,iVar10);
      b = local_50;
      local_88.padding.x = 0.0;
      local_88.padding.y = 0.0;
      b_00.x = (ctx->style).window.header.padding.x + (float)local_c8._0_4_ +
               (ctx->style).window.header.label_padding.x;
      fVar21 = (ctx->style).window.header.label_padding.y;
      fVar18 = (ctx->style).window.header.spacing.x;
      fVar19 = fVar18 + fVar18 + fVar19;
      fVar18 = ((float)local_d8 + (float)local_c8._0_4_) - b_00.x;
      if (fVar18 <= fVar19) {
        fVar19 = fVar18;
      }
      fVar18 = 0.0;
      if (0.0 <= fVar19) {
        fVar18 = fVar19;
      }
      b_00.y = (float)local_c8._4_4_ + fVar21;
      b_00.h = fVar21 + fVar21 + f->height;
      b_00.w = fVar18;
      nk_widget_text(local_50,b_00,string,iVar10,&local_88,0x11,f);
    }
    if ((pnVar16->flags & 0x8800) == 0) {
      fVar19 = (pnVar7->bounds).y + pnVar16->header_height;
      fVar21 = (pnVar7->bounds).x;
      fVar18 = (pnVar7->bounds).w;
      fVar20 = (pnVar7->bounds).h - pnVar16->header_height;
      img = &(ctx->style).window.fixed_background.data;
      if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
        r_00.y = fVar19;
        r_00.x = fVar21;
        r_00.h = fVar20;
        r_00.w = fVar18;
        nk_draw_image(b,r_00,&img->image,(nk_color)0xffffffff);
      }
      else {
        rect_00.y = fVar19;
        rect_00.x = fVar21;
        rect_00.h = fVar20;
        rect_00.w = fVar18;
        nk_fill_rect(b,rect_00,0.0,img->color);
      }
    }
    fVar21 = (pnVar16->bounds).y;
    fVar18 = (pnVar16->bounds).w;
    fVar19 = (pnVar16->bounds).h;
    (pnVar16->clip).x = (pnVar16->bounds).x;
    (pnVar16->clip).y = fVar21;
    (pnVar16->clip).w = fVar18;
    (pnVar16->clip).h = fVar19;
    local_98._0_4_ = (pnVar16->clip).x;
    local_98._4_4_ = (pnVar16->clip).y;
    fVar18 = (pnVar16->clip).w + (float)local_98;
    fVar21 = (pnVar16->clip).h + local_98._4_4_;
    local_a8._0_4_ = (pnVar7->buffer).clip.x;
    local_a8._4_4_ = (pnVar7->buffer).clip.y;
    if ((float)local_98 <= (float)local_a8) {
      local_98._0_4_ = (float)local_a8;
    }
    local_a8._0_4_ = (float)local_a8 + (pnVar7->buffer).clip.w;
    if (local_98._4_4_ <= local_a8._4_4_) {
      local_98._4_4_ = local_a8._4_4_;
    }
    if (fVar18 <= (float)local_a8) {
      local_a8._0_4_ = fVar18;
    }
    local_a8._4_4_ = local_a8._4_4_ + (pnVar7->buffer).clip.h;
    local_a8._0_4_ = (float)local_a8 - (float)local_98;
    if (fVar21 <= local_a8._4_4_) {
      local_a8._4_4_ = fVar21;
    }
    local_a8._4_4_ = local_a8._4_4_ - local_98._4_4_;
    if ((float)local_a8 <= 0.0) {
      local_a8._0_4_ = 0.0;
    }
    if (local_a8._4_4_ <= 0.0) {
      local_a8._4_4_ = 0.0;
    }
    uStack_9c = 0;
    uStack_a0 = 0;
    uStack_90 = 0;
    r_01.y = local_98._4_4_;
    r_01.x = (float)local_98;
    r_01.h = local_a8._4_4_;
    r_01.w = (float)local_a8;
    nk_push_scissor(b,r_01);
    (pnVar16->clip).x = (float)local_98;
    (pnVar16->clip).y = local_98._4_4_;
    (pnVar16->clip).w = (float)local_a8;
    (pnVar16->clip).h = local_a8._4_4_;
    uVar9 = (uint)(-1 < (short)pnVar16->flags);
    if ((pnVar16->flags >> 0xd & 1) != 0) {
      uVar9 = 0;
    }
  }
  else {
    nk_zero(pnVar7->layout,0x1c0);
    ctx->current->layout->type = panel_type;
    uVar9 = 0;
  }
  return uVar9;
}

Assistant:

NK_LIB int
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
    struct nk_input *in;
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_command_buffer *out;
    const struct nk_style *style;
    const struct nk_user_font *font;

    struct nk_vec2 scrollbar_size;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
    if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
        nk_zero(ctx->current->layout, sizeof(struct nk_panel));
        ctx->current->layout->type = panel_type;
        return 0;
    }
    /* pull state into local stack */
    style = &ctx->style;
    font = style->font;
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    win->buffer.userdata = ctx->userdata;
#endif
    /* pull style configuration into local stack */
    scrollbar_size = style->window.scrollbar_size;
    panel_padding = nk_panel_get_padding(style, panel_type);

    /* window movement */
    if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
        int left_mouse_down;
        int left_mouse_clicked;
        int left_mouse_click_in_cursor;

        /* calculate draggable window space */
        struct nk_rect header;
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        if (nk_panel_has_header(win->flags, title)) {
            header.h = font->height + 2.0f * style->window.header.padding.y;
            header.h += 2.0f * style->window.header.label_padding.y;
        } else header.h = panel_padding.y;

        /* window movement by dragging */
        left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
        left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
        left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, header, nk_true);
        if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
            win->bounds.x = win->bounds.x + in->mouse.delta.x;
            win->bounds.y = win->bounds.y + in->mouse.delta.y;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
            ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
        }
    }

    /* setup panel */
    layout->type = panel_type;
    layout->flags = win->flags;
    layout->bounds = win->bounds;
    layout->bounds.x += panel_padding.x;
    layout->bounds.w -= 2*panel_padding.x;
    if (win->flags & NK_WINDOW_BORDER) {
        layout->border = nk_panel_get_border(style, win->flags, panel_type);
        layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
    } else layout->border = 0;
    layout->at_y = layout->bounds.y;
    layout->at_x = layout->bounds.x;
    layout->max_x = 0;
    layout->header_height = 0;
    layout->footer_height = 0;
    nk_layout_reset_min_row_height(ctx);
    layout->row.index = 0;
    layout->row.columns = 0;
    layout->row.ratio = 0;
    layout->row.item_width = 0;
    layout->row.tree_depth = 0;
    layout->row.height = panel_padding.y;
    layout->has_scrolling = nk_true;
    if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
        layout->bounds.w -= scrollbar_size.x;
    if (!nk_panel_is_nonblock(panel_type)) {
        layout->footer_height = 0;
        if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
            layout->footer_height = scrollbar_size.y;
        layout->bounds.h -= layout->footer_height;
    }

    /* panel header */
    if (nk_panel_has_header(win->flags, title))
    {
        struct nk_text text;
        struct nk_rect header;
        const struct nk_style_item *background = 0;

        /* calculate header bounds */
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        header.h = font->height + 2.0f * style->window.header.padding.y;
        header.h += (2.0f * style->window.header.label_padding.y);

        /* shrink panel by header */
        layout->header_height = header.h;
        layout->bounds.y += header.h;
        layout->bounds.h -= header.h;
        layout->at_y += header.h;

        /* select correct header background and text color */
        if (ctx->active == win) {
            background = &style->window.header.active;
            text.text = style->window.header.label_active;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
            background = &style->window.header.hover;
            text.text = style->window.header.label_hover;
        } else {
            background = &style->window.header.normal;
            text.text = style->window.header.label_normal;
        }

        /* draw header background */
        header.h += 1.0f;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            text.background = nk_rgba(0,0,0,0);
            nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, background->data.color);
        }

        /* window close button */
        {struct nk_rect button;
        button.y = header.y + style->window.header.padding.y;
        button.h = header.h - 2 * style->window.header.padding.y;
        button.w = button.h;
        if (win->flags & NK_WINDOW_CLOSABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
                header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
            } else {
                button.x = header.x + style->window.header.padding.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }

            if (nk_do_button_symbol(&ws, &win->buffer, button,
                style->window.header.close_symbol, NK_BUTTON_DEFAULT,
                &style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
            {
                layout->flags |= NK_WINDOW_HIDDEN;
                layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
            }
        }

        /* window minimize button */
        if (win->flags & NK_WINDOW_MINIMIZABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - button.w;
                if (!(win->flags & NK_WINDOW_CLOSABLE)) {
                    button.x -= style->window.header.padding.x;
                    header.w -= style->window.header.padding.x;
                }
                header.w -= button.w + style->window.header.spacing.x;
            } else {
                button.x = header.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }
            if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
                style->window.header.maximize_symbol: style->window.header.minimize_symbol,
                NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
                layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
                    layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
                    layout->flags | NK_WINDOW_MINIMIZED;
        }}

        {/* window header title */
        int text_len = nk_strlen(title);
        struct nk_rect label = {0,0,0,0};
        float t = font->width(font->userdata, font->height, title, text_len);
        text.padding = nk_vec2(0,0);

        label.x = header.x + style->window.header.padding.x;
        label.x += style->window.header.label_padding.x;
        label.y = header.y + style->window.header.label_padding.y;
        label.h = font->height + 2 * style->window.header.label_padding.y;
        label.w = t + 2 * style->window.header.spacing.x;
        label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
        nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
    }

    /* draw window background */
    if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
        struct nk_rect body;
        body.x = win->bounds.x;
        body.w = win->bounds.w;
        body.y = (win->bounds.y + layout->header_height);
        body.h = (win->bounds.h - layout->header_height);
        if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
        else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
    }

    /* set clipping rectangle */
    {struct nk_rect clip;
    layout->clip = layout->bounds;
    nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
        layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
    nk_push_scissor(out, clip);
    layout->clip = clip;}
    return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}